

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLDefectsTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLDefectsTest_invalid_handling_of_unsigned_int_16_Test::TestBody
          (OpenDDLDefectsTest_invalid_handling_of_unsigned_int_16_Test *this)

{
  size_t len;
  OpenDDLParser myParser;
  char token [1458];
  OpenDDLParser local_620;
  char local_5c8 [1464];
  
  memcpy(local_5c8,
         "Metric( key = \"up\" ) { string{ \"y\" } }\n\nGeometryObject /*mesh*/{\n   Mesh( primitive = \"triangle_strip\" ) {\n       VertexArray( attrib = \"position\" ) {\n           float[ 3 ]{\n               { 0.0, 1.0, 3.0 },{ -1.0, 2.0, 2.0 },{ 3.0, 3.0, 1.0 }\n           }\n       }\n       VertexArray( attrib = \"normal\" ) {\n           float[ 3 ]{\n               { 0.0, 1.0, 0.0 },{ -1.0, 0.0, 0.0 },{ 0.0, 0.0, 1.0 }\n           }\n       }\n       VertexArray( attrib = \"texcoord\" ) {\n           float[ 2 ]{\n               { 0.5, 0.5 },{ 0.5, 1.0 },{ 1.0, 1.0 }\n           }\n       }\n       VertexArray( attrib = \"texcoord\" ) {\n           float[ 2 ]{\n               { 0.5, 1.0 },{ 1.0, 0.5 },{ 0.5, 0.5 }\n           }\n       }\n       VertexArray( attrib = \"color\" ) { float{} }\n   }\n}\n\nGeometryObject /*meshIndexed*/{\n   Mesh( primitive = \"triangles\" ) {\n       VertexArray( attrib = \"position\" ) {\n           float[ 3 ]{\n               { 0.0, 1.0, 3.0 },{ -1.0, 2.0, 2.0 },{ 3.0, 3.0, 1.0 },{ 5.0, 7.0, 0.5 }\n           }\n       }\n\n   IndexArray{ unsigned_int16[ 3 ]{\n       { 2, 0, 1 },{ 1, 2, 3 }\n   }\n}\n}\n}\n\nGeometryObject /*meshEnlargeShrink*/{\nMesh{\nVertexArray( attrib = \"position\" ) {\nfloat[ 4 ]{\n    { 0.0, 1.0, 3.0, 0.5 },{ -1.0, 2.0, 2.0, 1.0 },{ 3.0, 3.0, 1.0, 1.0 }\n}\n}\nVertexArray( attrib = \"normal\" ) {\nfloat[ 2 ]{\n    { 0.0, 1.0 },{ -1.0, 0.0 },{ 1.0, 0.0 }\n}\n}\nVertexArray( attrib = \"texcoord\" ) {\n    float[ 1 ]{\n        { 0.5 },{ 0.0 },{ 1.0 }\n    }\n}\n}\n}\n"
         ,0x5b2);
  OpenDDLParser::OpenDDLParser(&local_620);
  len = strlen(local_5c8);
  OpenDDLParser::setBuffer(&local_620,local_5c8,len);
  OpenDDLParser::parse(&local_620);
  OpenDDLParser::~OpenDDLParser(&local_620);
  return;
}

Assistant:

TEST_F( OpenDDLDefectsTest, invalid_handling_of_unsigned_int_16 ) {
    char token[] = {
        "Metric( key = \"up\" ) { string{ \"y\" } }\n"
        "\n"
        "GeometryObject /*mesh*/{\n"
        "   Mesh( primitive = \"triangle_strip\" ) {\n"
        "       VertexArray( attrib = \"position\" ) {\n"
        "           float[ 3 ]{\n"
        "               { 0.0, 1.0, 3.0 },{ -1.0, 2.0, 2.0 },{ 3.0, 3.0, 1.0 }\n"
        "           }\n"
        "       }\n"
        "       VertexArray( attrib = \"normal\" ) {\n"
        "           float[ 3 ]{\n"
        "               { 0.0, 1.0, 0.0 },{ -1.0, 0.0, 0.0 },{ 0.0, 0.0, 1.0 }\n"
        "           }\n"
        "       }\n"
        "       VertexArray( attrib = \"texcoord\" ) {\n"
        "           float[ 2 ]{\n"
        "               { 0.5, 0.5 },{ 0.5, 1.0 },{ 1.0, 1.0 }\n"
        "           }\n"
        "       }\n"
        "       VertexArray( attrib = \"texcoord\" ) {\n"
        "           float[ 2 ]{\n"
        "               { 0.5, 1.0 },{ 1.0, 0.5 },{ 0.5, 0.5 }\n"
        "           }\n"
        "       }\n"
        "       VertexArray( attrib = \"color\" ) { float{} }\n"
        "   }\n"
        "}\n"
        "\n"
        "GeometryObject /*meshIndexed*/{\n"
        "   Mesh( primitive = \"triangles\" ) {\n"
        "       VertexArray( attrib = \"position\" ) {\n"
        "           float[ 3 ]{\n"
        "               { 0.0, 1.0, 3.0 },{ -1.0, 2.0, 2.0 },{ 3.0, 3.0, 1.0 },{ 5.0, 7.0, 0.5 }\n"
        "           }\n"
        "       }\n"
        "\n"
        "   IndexArray{ unsigned_int16[ 3 ]{\n"
        "       { 2, 0, 1 },{ 1, 2, 3 }\n"
        "   }\n" 
        "}\n"
        "}\n"
        "}\n"
        "\n"
        "GeometryObject /*meshEnlargeShrink*/{\n"
        "Mesh{\n"
        "VertexArray( attrib = \"position\" ) {\n"
        "float[ 4 ]{\n"
        "    { 0.0, 1.0, 3.0, 0.5 },{ -1.0, 2.0, 2.0, 1.0 },{ 3.0, 3.0, 1.0, 1.0 }\n"
        "}\n"
        "}\n"
        "VertexArray( attrib = \"normal\" ) {\n"
        "float[ 2 ]{\n"
        "    { 0.0, 1.0 },{ -1.0, 0.0 },{ 1.0, 0.0 }\n"
        "}\n"
        "}\n"
        "VertexArray( attrib = \"texcoord\" ) {\n"
        "    float[ 1 ]{\n"
        "        { 0.5 },{ 0.0 },{ 1.0 }\n"
        "    }\n"
        "}\n"
        "}\n"
        "}\n" 
    };
    OpenDDLParser myParser;
    myParser.setBuffer( token, strlen( token ) );
    const bool ok( myParser.parse() );
    //EXPECT_TRUE( ok );
}